

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_ClassArray<ON_BrepFace>::Empty(ON_ClassArray<ON_BrepFace> *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)this->m_count;
  if (0 < lVar1) {
    lVar2 = lVar1 + 1;
    lVar1 = lVar1 * 0xd8;
    do {
      (**(code **)(*(long *)(this->m_a[-1].m_face_uuid.Data4 + lVar1 + -0x5c) + 0x18))
                (this->m_a[-1].m_face_uuid.Data4 + lVar1 + -0x5c);
      memset(this->m_a[-1].m_face_uuid.Data4 + lVar1 + -0x5c,0,0xd8);
      ON_BrepFace::ON_BrepFace((ON_BrepFace *)(this->m_a[-1].m_face_uuid.Data4 + lVar1 + -0x5c));
      lVar2 = lVar2 + -1;
      lVar1 = lVar1 + -0xd8;
    } while (1 < lVar2);
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}